

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

void bssl::ssl_maybe_shed_handshake_config(SSL *ssl)

{
  SSL_CONFIG *pSVar1;
  bool bVar2;
  
  if ((((ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl == (SSL_HANDSHAKE *)0x0) &&
      (pSVar1 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl,
      pSVar1 != (SSL_CONFIG *)0x0)) && ((pSVar1->field_0x10d & 0x80) != 0)) {
    bVar2 = ssl_can_renegotiate(ssl);
    if (!bVar2) {
      std::__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)&ssl->config,
                 (pointer)0x0);
      return;
    }
  }
  return;
}

Assistant:

static void ssl_maybe_shed_handshake_config(SSL *ssl) {
  if (ssl->s3->hs != nullptr ||               //
      ssl->config == nullptr ||               //
      !ssl->config->shed_handshake_config ||  //
      ssl_can_renegotiate(ssl)) {
    return;
  }

  ssl->config.reset();
}